

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void SSL_get0_alpn_selected(SSL *ssl,uint8_t **out_data,uint *out_len)

{
  int iVar1;
  pointer pSVar2;
  pointer psVar3;
  size_t sVar4;
  uchar *puVar5;
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  undefined1 local_30 [8];
  Span<const_unsigned_char> protocol;
  uint *out_len_local;
  uint8_t **out_data_local;
  SSL *ssl_local;
  
  protocol.size_ = (size_t)out_len;
  bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_30);
  iVar1 = SSL_in_early_data(ssl);
  if ((iVar1 == 0) || ((ssl->field_0xa4 & 1) != 0)) {
    bssl::Span<unsigned_char_const>::
    Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_50,&ssl->s3->alpn_selected);
    local_30 = (undefined1  [8])local_50;
    protocol.data_ = local_48;
  }
  else {
    pSVar2 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&ssl->s3->hs)
    ;
    psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                       (&pSVar2->early_session);
    bssl::Span<unsigned_char_const>::
    Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_40,&psVar3->early_alpn);
    local_30 = (undefined1  [8])local_40;
    protocol.data_ = local_38;
  }
  sVar4 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_30);
  if (sVar4 < 0xffffffff) {
    puVar5 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_30);
    *out_data = puVar5;
    sVar4 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_30);
    *(int *)protocol.size_ = (int)sVar4;
    return;
  }
  __assert_fail("protocol.size() < UINT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0x8ca,"void SSL_get0_alpn_selected(const SSL *, const uint8_t **, unsigned int *)")
  ;
}

Assistant:

void SSL_get0_alpn_selected(const SSL *ssl, const uint8_t **out_data,
                            unsigned *out_len) {
  Span<const uint8_t> protocol;
  if (SSL_in_early_data(ssl) && !ssl->server) {
    protocol = ssl->s3->hs->early_session->early_alpn;
  } else {
    protocol = ssl->s3->alpn_selected;
  }
  // ALPN protocols have one-byte lengths, so they must fit in |unsigned|.
  assert(protocol.size() < UINT_MAX);
  *out_data = protocol.data();
  *out_len = static_cast<unsigned>(protocol.size());
}